

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommenderValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)501>(Result *__return_storage_ptr__,Model *format)

{
  bool bVar1;
  ModelDescription *interface;
  undefined1 local_78 [40];
  Recommender local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  Result result;
  
  interface = format->description_;
  if (interface == (ModelDescription *)0x0) {
    interface = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  Result::Result(&result);
  validateModelDescription((Result *)local_78,interface,format->specificationversion_);
  Result::operator=(&result,(Result *)local_78);
  std::__cxx11::string::~string((string *)(local_78 + 8));
  bVar1 = Result::good(&result);
  if (bVar1) {
    Recommender::constructAndValidateItemSimilarityRecommenderFromSpec(local_50,format);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    Result::Result(__return_storage_ptr__);
  }
  else {
    Result::Result(__return_storage_ptr__,&result);
  }
  std::__cxx11::string::~string((string *)&result.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_itemSimilarityRecommender>(const Specification::Model& format) {
        const auto& interface = format.description();

        Result result;

            // Validate its a MLModel type.
        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        try {
            Recommender::constructAndValidateItemSimilarityRecommenderFromSpec(format);

        } catch (const std::exception& error) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, error.what());
        }

        return Result();
    }